

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  char acStack_34 [4];
  char *local_30;
  undefined8 local_28;
  long local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  local_28 = *(undefined8 *)left->data;
  local_20 = *(long *)(left->data + 8);
  uVar3 = *(ulong *)right->data;
  local_30 = *(char **)((long)right->data + 8);
  uVar2 = (uint)uVar3;
  uVar4 = (uint)local_28;
  if (uVar4 < uVar2) {
LAB_00a172d6:
    bVar6 = false;
  }
  else {
    uVar3 = uVar3 & 0xffffffff;
    if (uVar2 < 5) {
      if (uVar3 == 0) {
        bVar6 = true;
      }
      else {
        lVar5 = 0;
        do {
          bVar6 = *(char *)((long)&local_28 + lVar5 + 4) == acStack_34[lVar5];
          if (!bVar6) break;
          bVar7 = uVar3 - 1 != lVar5;
          lVar5 = lVar5 + 1;
        } while (bVar7);
      }
    }
    else {
      lVar5 = 0;
      do {
        if (*(char *)((long)&local_28 + lVar5 + 4) != acStack_34[lVar5]) goto LAB_00a172d6;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if (uVar4 < 0xd) {
        local_20 = (long)&local_28 + 4;
      }
      if (uVar2 < 0xd) {
        local_30 = acStack_34;
      }
      lVar5 = 0;
      do {
        bVar6 = *(char *)(local_20 + 4 + lVar5) == local_30[lVar5 + 4];
        if (!bVar6) break;
        bVar7 = uVar3 - 5 != lVar5;
        lVar5 = lVar5 + 1;
      } while (bVar7);
    }
  }
  *result->data = bVar6;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}